

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::cmake(cmake *this,Role role,Mode mode)

{
  pointer pcVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  insert_iterator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iVar5;
  unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_> local_60;
  unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_> local_58;
  cmStateSnapshot local_50;
  unique_ptr<cmState,_std::default_delete<cmState>_> local_38;
  unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_> local_30 [3];
  Mode local_18;
  Role local_14;
  Mode mode_local;
  Role role_local;
  cmake *this_local;
  
  local_18 = mode;
  local_14 = role;
  _mode_local = this;
  std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::vector
            (&this->Generators);
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::vector(&this->ExtraGenerators);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::map(&this->DiagLevels);
  std::__cxx11::string::string((string *)&this->GeneratorInstance);
  std::__cxx11::string::string((string *)&this->GeneratorPlatform);
  std::__cxx11::string::string((string *)&this->GeneratorToolset);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::function(&this->ProgressCallback);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map(&this->UsedCliVariables);
  std::__cxx11::string::string((string *)&this->CMakeEditCommand);
  std::__cxx11::string::string((string *)&this->CXXEnvironment);
  std::__cxx11::string::string((string *)&this->CCEnvironment);
  std::__cxx11::string::string((string *)&this->CheckBuildSystemArgument);
  std::__cxx11::string::string((string *)&this->CheckStampFile);
  std::__cxx11::string::string((string *)&this->CheckStampList);
  std::__cxx11::string::string((string *)&this->VSSolutionFile);
  std::__cxx11::string::string((string *)&this->EnvironmentGenerator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SourceFileExtensions);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->SourceFileExtensionsSet);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HeaderFileExtensions);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->HeaderFileExtensionsSet);
  std::unique_ptr<cmFileTimeCache,std::default_delete<cmFileTimeCache>>::
  unique_ptr<std::default_delete<cmFileTimeCache>,void>
            ((unique_ptr<cmFileTimeCache,std::default_delete<cmFileTimeCache>> *)
             &this->FileTimeCache);
  std::__cxx11::string::string((string *)&this->GraphVizFile);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::map(&this->InstalledFiles);
  std::unique_ptr<cmVariableWatch,std::default_delete<cmVariableWatch>>::
  unique_ptr<std::default_delete<cmVariableWatch>,void>
            ((unique_ptr<cmVariableWatch,std::default_delete<cmVariableWatch>> *)
             &this->VariableWatch);
  std::unique_ptr<cmFileAPI,std::default_delete<cmFileAPI>>::
  unique_ptr<std::default_delete<cmFileAPI>,void>
            ((unique_ptr<cmFileAPI,std::default_delete<cmFileAPI>> *)&this->FileAPI);
  std::unique_ptr<cmState,std::default_delete<cmState>>::
  unique_ptr<std::default_delete<cmState>,void>
            ((unique_ptr<cmState,std::default_delete<cmState>> *)&this->State);
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  std::unique_ptr<cmMessenger,std::default_delete<cmMessenger>>::
  unique_ptr<std::default_delete<cmMessenger>,void>
            ((unique_ptr<cmMessenger,std::default_delete<cmMessenger>> *)&this->Messenger);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->TraceOnlyThisSources);
  this->MessageLogLevel = LOG_STATUS;
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->DebugTryCompile = false;
  this->ClearBuildSystem = false;
  std::make_unique<cmFileTimeCache>();
  std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::operator=
            (&this->FileTimeCache,local_30);
  std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::~unique_ptr(local_30);
  std::make_unique<cmState>();
  std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator=(&this->State,&local_38);
  std::unique_ptr<cmState,_std::default_delete<cmState>_>::~unique_ptr(&local_38);
  pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::SetMode(pcVar1,local_18);
  pcVar1 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::CreateBaseSnapshot(&local_50,pcVar1);
  (this->CurrentSnapshot).Position.Position = local_50.Position.Position;
  (this->CurrentSnapshot).State = local_50.State;
  (this->CurrentSnapshot).Position.Tree = local_50.Position.Tree;
  std::make_unique<cmMessenger>();
  std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator=
            (&this->Messenger,&local_58);
  std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::~unique_ptr(&local_58);
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  this->GeneratorInstanceSet = false;
  this->GeneratorPlatformSet = false;
  this->GeneratorToolsetSet = false;
  this->CurrentWorkingMode = NORMAL_MODE;
  std::make_unique<cmVariableWatch>();
  std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::operator=
            (&this->VariableWatch,&local_60);
  std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::~unique_ptr(&local_60);
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if ((local_14 == RoleScript) || (local_14 == RoleProject)) {
    AddScriptingCommands(this);
  }
  if (local_14 == RoleProject) {
    AddProjectCommands(this);
  }
  if (local_18 == Project) {
    LoadEnvironmentPresets(this);
  }
  cmSystemTools::EnableVSConsoleOutput();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [2])0x900069);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [2])0x898231);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [4])0x8aae99);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [3])0x8aae9e);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [4])0x907274);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [4])0x8c61f1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [3])0x8aaec6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [2])0x8aae90);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [2])0x8ab49b);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->SourceFileExtensions,(char (*) [3])0x8aaea2);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->SourceFileExtensions);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->SourceFileExtensions);
  iVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->SourceFileExtensionsSet);
  iVar5 = std::
          inserter<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&this->SourceFileExtensionsSet,iVar4);
  std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::insert_iterator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar2._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar3._M_current,iVar5);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [2])0x89dc88);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [3])"hh");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [4])0x8aaecd);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [3])0x8aaed2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [4])0x8aaed6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [4])0x8aaedb);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [3])0x8cc8e6);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HeaderFileExtensions,(char (*) [4])0x8aaee0);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&this->HeaderFileExtensions);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->HeaderFileExtensions);
  iVar4 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->HeaderFileExtensionsSet);
  iVar5 = std::
          inserter<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&this->HeaderFileExtensionsSet,iVar4);
  std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::insert_iterator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar2._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar3._M_current,iVar5);
  return;
}

Assistant:

cmake::cmake(Role role, cmState::Mode mode)
{
  this->Trace = false;
  this->TraceExpand = false;
  this->WarnUninitialized = false;
  this->WarnUnused = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->DebugOutput = false;
  this->DebugTryCompile = false;
  this->ClearBuildSystem = false;
  this->FileTimeCache = cm::make_unique<cmFileTimeCache>();

  this->State = cm::make_unique<cmState>();
  this->State->SetMode(mode);
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();
  this->Messenger = cm::make_unique<cmMessenger>();

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif

  this->GlobalGenerator = nullptr;
  this->GeneratorInstanceSet = false;
  this->GeneratorPlatformSet = false;
  this->GeneratorToolsetSet = false;
  this->CurrentWorkingMode = NORMAL_MODE;

#ifdef CMAKE_BUILD_WITH_CMAKE
  this->VariableWatch = cm::make_unique<cmVariableWatch>();
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  if (mode == cmState::Project) {
    this->LoadEnvironmentPresets();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions
  // these are used to find files when the extension
  // is not given
  // The "c" extension MUST precede the "C" extension.
  this->SourceFileExtensions.emplace_back("c");
  this->SourceFileExtensions.emplace_back("C");

  this->SourceFileExtensions.emplace_back("c++");
  this->SourceFileExtensions.emplace_back("cc");
  this->SourceFileExtensions.emplace_back("cpp");
  this->SourceFileExtensions.emplace_back("cxx");
  this->SourceFileExtensions.emplace_back("cu");
  this->SourceFileExtensions.emplace_back("m");
  this->SourceFileExtensions.emplace_back("M");
  this->SourceFileExtensions.emplace_back("mm");

  std::copy(this->SourceFileExtensions.begin(),
            this->SourceFileExtensions.end(),
            std::inserter(this->SourceFileExtensionsSet,
                          this->SourceFileExtensionsSet.end()));

  this->HeaderFileExtensions.emplace_back("h");
  this->HeaderFileExtensions.emplace_back("hh");
  this->HeaderFileExtensions.emplace_back("h++");
  this->HeaderFileExtensions.emplace_back("hm");
  this->HeaderFileExtensions.emplace_back("hpp");
  this->HeaderFileExtensions.emplace_back("hxx");
  this->HeaderFileExtensions.emplace_back("in");
  this->HeaderFileExtensions.emplace_back("txx");

  std::copy(this->HeaderFileExtensions.begin(),
            this->HeaderFileExtensions.end(),
            std::inserter(this->HeaderFileExtensionsSet,
                          this->HeaderFileExtensionsSet.end()));
}